

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

SUNErrCode N_VEnableWrmsNormMaskVectorArray_ManyVector(N_Vector v,int tf)

{
  code *pcVar1;
  
  pcVar1 = (_func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_N_Vector_sunrealtype_ptr *)0x0;
  if (tf != 0) {
    pcVar1 = N_VWrmsNormMaskVectorArray_ManyVector;
  }
  v->ops->nvwrmsnormmaskvectorarray = pcVar1;
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VEnableWrmsNormMaskVectorArray)(N_Vector v,
                                                      sunbooleantype tf)
{
  /* enable/disable operation */
  if (tf)
  {
    v->ops->nvwrmsnormmaskvectorarray = MVAPPEND(N_VWrmsNormMaskVectorArray);
  }
  else { v->ops->nvwrmsnormmaskvectorarray = NULL; }

  /* return success */
  return SUN_SUCCESS;
}